

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O1

float Abc_NtkComputeNodeLoad(Bus_Man_t *p,Abc_Obj_t *pObj)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  float fVar6;
  
  iVar1 = pObj->Id;
  if ((-1 < (long)iVar1) &&
     (lVar4 = *(long *)((long)pObj->pNtk->pBSMan + 0x48), iVar1 < *(int *)(lVar4 + 4))) {
    fVar6 = *(float *)(*(long *)(lVar4 + 8) + (long)iVar1 * 4);
    if ((fVar6 != 0.0) || (NAN(fVar6))) {
      __assert_fail("Bus_SclObjLoad(pObj) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclBufSize.c"
                    ,0xd8,"float Abc_NtkComputeNodeLoad(Bus_Man_t *, Abc_Obj_t *)");
    }
    fVar6 = Abc_SclFindWireLoad(p->vWireCaps,(pObj->vFanouts).nSize);
    lVar4 = (long)(pObj->vFanouts).nSize;
    if (0 < lVar4) {
      lVar5 = 0;
      do {
        plVar2 = (long *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar5]];
        iVar1 = (int)plVar2[2];
        if (((long)iVar1 < 0) ||
           (lVar3 = *(long *)(*(long *)(*plVar2 + 0x168) + 0x38), *(int *)(lVar3 + 4) <= iVar1))
        goto LAB_003ddcfa;
        fVar6 = fVar6 + *(float *)(*(long *)(lVar3 + 8) + (long)iVar1 * 4);
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
    iVar1 = pObj->Id;
    if ((-1 < (long)iVar1) &&
       (lVar4 = *(long *)((long)pObj->pNtk->pBSMan + 0x48), iVar1 < *(int *)(lVar4 + 4))) {
      *(float *)(*(long *)(lVar4 + 8) + (long)iVar1 * 4) = fVar6;
      return fVar6;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
                  ,0x184,"void Vec_FltWriteEntry(Vec_Flt_t *, int, float)");
  }
LAB_003ddcfa:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
                ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
}

Assistant:

float Abc_NtkComputeNodeLoad( Bus_Man_t * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    float Load;
    int i;
    assert( Bus_SclObjLoad(pObj) == 0 );
    Load = Abc_SclFindWireLoad( p->vWireCaps, Abc_ObjFanoutNum(pObj) );
    Abc_ObjForEachFanout( pObj, pFanout, i )
        Load += Bus_SclObjCin( pFanout );
    Bus_SclObjSetLoad( pObj, Load );
    return Load;
}